

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic-sensor.cpp
# Opt level: O1

void __thiscall
stateObservation::AlgebraicSensor::setState(AlgebraicSensor *this,Vector *state,TimeIndex k)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  double dVar5;
  int iVar6;
  Index size;
  int extraout_var;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Index dstRows;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  
  uVar8 = this->concat_;
  pdVar2 = (state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (-1 < (long)uVar8 || pdVar2 == (double *)0x0) {
    uVar7 = (state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
            - uVar8;
    if ((long)(uVar7 | uVar8) < 0) {
LAB_0013e101:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    if ((this->directInputToOutput_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows != uVar8) {
      if ((long)uVar8 < 0) goto LAB_0013e13f;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)&this->directInputToOutput_,uVar8,uVar8,1);
    }
    uVar3 = (this->directInputToOutput_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (uVar3 == uVar8) {
      pdVar4 = (this->directInputToOutput_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar8 = uVar3 - ((long)uVar3 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar3) {
        lVar9 = 0;
        do {
          dVar5 = (pdVar2 + uVar7 + lVar9)[1];
          pdVar1 = pdVar4 + lVar9;
          *pdVar1 = pdVar2[uVar7 + lVar9];
          pdVar1[1] = dVar5;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar3) {
        do {
          pdVar4[uVar8] = pdVar2[uVar7 + uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
      iVar6 = (*(this->super_SensorBase)._vptr_SensorBase[0xe])(this);
      uVar8 = CONCAT44(extraout_var,iVar6);
      pdVar2 = (state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      if (extraout_var < 0 && pdVar2 != (double *)0x0) goto LAB_0013e0e2;
      if ((extraout_var < 0) ||
         ((state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          (long)uVar8)) goto LAB_0013e101;
      if ((this->state_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows != uVar8) {
        if (extraout_var < 0) {
LAB_0013e13f:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<double,__1,__1,_1,_0> *)&this->state_,uVar8,uVar8,1);
      }
      uVar7 = (this->state_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      if (uVar7 == uVar8) {
        pdVar4 = (this->state_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar8 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar7) {
          lVar9 = 0;
          do {
            dVar5 = (pdVar2 + lVar9)[1];
            pdVar1 = pdVar4 + lVar9;
            *pdVar1 = pdVar2[lVar9];
            pdVar1[1] = dVar5;
            lVar9 = lVar9 + 2;
          } while (lVar9 < (long)uVar8);
        }
        if ((long)uVar8 < (long)uVar7) {
          do {
            pdVar4[uVar8] = pdVar2[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        this->storedNoisyMeasurement_ = false;
        this->storedNoiselessMeasurement_ = false;
        this->time_ = k;
        return;
      }
    }
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, T1 = double, T2 = double]"
                 );
  }
LAB_0013e0e2:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
               );
}

Assistant:

void AlgebraicSensor::setState(const Vector & state, TimeIndex k)
{
  directInputToOutput_ = state.tail(concat_);
  state_ = state.head(getStateSize_());
  storedNoisyMeasurement_ = false;
  storedNoiselessMeasurement_ = false;

  time_ = k;
}